

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem_file_descriptor.c
# Opt level: O0

file_descriptor file_descriptor_create(directory_descriptor owner,char *name)

{
  directory_descriptor in_RDI;
  file_descriptor f;
  file_descriptor local_8;
  
  local_8 = (file_descriptor)malloc(0x120);
  if (local_8 == (file_descriptor)0x0) {
    local_8 = (file_descriptor)0x0;
  }
  else {
    local_8->owner = in_RDI;
  }
  return local_8;
}

Assistant:

file_descriptor file_descriptor_create(directory_descriptor owner, const char *name)
{
	file_descriptor f = malloc(sizeof(struct file_descriptor_type));

	if (f != NULL)
	{
		f->owner = owner;

		/* TODO: extract name & extension */

		(void)name;

		return f;
	}

	return NULL;
}